

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *
testing::ContainsRegex<char_const*>(StringLike<const_char_*> *regex)

{
  char *pcVar1;
  undefined8 *in_RSI;
  RE *in_RDI;
  string *in_stack_ffffffffffffff88;
  RE *this;
  RE *in_stack_ffffffffffffffc8;
  string local_30 [32];
  undefined8 *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  operator_new(0x90);
  pcVar1 = (char *)*local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,(allocator *)&stack0xffffffffffffffcf);
  internal::RE::RE(this,in_stack_ffffffffffffff88);
  ContainsRegex(in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  return (PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)in_RDI;
}

Assistant:

PolymorphicMatcher<internal::MatchesRegexMatcher> ContainsRegex(
    const internal::StringLike<T>& regex) {
  return ContainsRegex(new internal::RE(std::string(regex)));
}